

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  long local_828;
  size_t n;
  char local_818 [6];
  _Bool keep_printing_b;
  _Bool keep_printing_a;
  char word_b [1024];
  char word_a [1024];
  char **argv_local;
  int argc_local;
  
  printf("Please input two words to be displayed vertically:\n");
  do {
    printf("> ");
    pcVar4 = fgets(word_b + 0x3f8,0x400,_stdin);
    if (pcVar4 == (char *)0x0) {
      return 1;
    }
  } while (word_b[0x3f8] == '\n');
  do {
    printf("> ");
    pcVar4 = fgets(local_818,0x400,_stdin);
    if (pcVar4 == (char *)0x0) {
      return 1;
    }
  } while (local_818[0] == '\n');
  bVar1 = true;
  bVar2 = true;
  local_828 = 0;
  do {
    if (bVar1) {
      if ((word_b[local_828 + 0x3f8] == '\0') || (word_b[local_828 + 0x3f8] == '\n')) {
        bVar1 = false;
      }
      else {
        printf("%c ",(ulong)(uint)(int)word_b[local_828 + 0x3f8]);
      }
    }
    else {
      printf("  ");
    }
    if (bVar2) {
      if ((local_818[local_828] == '\0') || (local_818[local_828] == '\n')) {
        bVar2 = false;
      }
      else {
        printf("%c",(ulong)(uint)(int)local_818[local_828]);
      }
    }
    printf("\n");
    local_828 = local_828 + 1;
    bVar3 = true;
    if (!bVar1) {
      bVar3 = bVar2;
    }
  } while (bVar3);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word_a[1024];
  char word_b[1024];
  printf("Please input two words to be displayed vertically:\n");

  do {
    printf("> ");
    if (fgets(word_a, sizeof word_a, stdin) == NULL) return 1;
  } while (word_a[0] == '\n');
  do {
    printf("> ");
    if (fgets(word_b, sizeof word_b, stdin) == NULL) return 1;
  } while (word_b[0] == '\n');

  bool keep_printing_a = true;
  bool keep_printing_b = true;
  size_t n = 0;
  do {
    if (keep_printing_a) {
      if (word_a[n] != 0 && word_a[n] != '\n') printf("%c ", word_a[n]);
      else keep_printing_a = false;
    } else {
      printf("  ");
    }

    if (keep_printing_b) {
      if (word_b[n] != 0 && word_b[n] != '\n') printf("%c", word_b[n]);
      else keep_printing_b = false;
    }

    printf("\n");
    n++;
  } while (keep_printing_a || keep_printing_b);

  return 0;
}